

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *p,Ivy_Obj_t *pOld,Ivy_Obj_t *pNew)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  timespec ts;
  timespec local_40;
  
  if (pOld == (Ivy_Obj_t *)0x0 && pNew == (Ivy_Obj_t *)0x0) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0xa50,
                  "int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if ((p->pSat->act_vars).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (p->pSat->act_vars).size = 0;
  Ivy_ManIncrementTravId(p->pManFraig);
  dVar1 = p->pParams->dActConeRatio;
  if ((dVar1 <= 0.0) || (1.0 <= dVar1)) {
    __assert_fail("p->pParams->dActConeRatio > 0 && p->pParams->dActConeRatio < 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0xa57,
                  "int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  if (pNew == (Ivy_Obj_t *)0x0) {
    if (pOld != (Ivy_Obj_t *)0x0) {
      uVar7 = *(uint *)&pOld->field_0x8 >> 0xb;
      goto LAB_007e20e3;
    }
LAB_007e2118:
    iVar3 = (int)((1.0 - dVar1) * 0.0);
    uVar7 = 0;
LAB_007e212b:
    if (pNew == (Ivy_Obj_t *)0x0) goto LAB_007e2146;
  }
  else {
    uVar2 = *(uint *)&pNew->field_0x8;
    if (pOld != (Ivy_Obj_t *)0x0) {
      uVar7 = *(uint *)&pOld->field_0x8 >> 0xb;
      if (uVar7 < uVar2 >> 0xb) {
        uVar7 = uVar2 >> 0xb;
      }
LAB_007e20e3:
      iVar3 = (int)((1.0 - dVar1) * (double)uVar7);
      if (pOld->Id != 0) {
        Ivy_FraigSetActivityFactors_rec(p,pOld,iVar3,uVar7);
      }
      goto LAB_007e212b;
    }
    if (uVar2 < 0x800) goto LAB_007e2118;
    uVar7 = uVar2 >> 0xb;
    iVar3 = (int)((1.0 - dVar1) * (double)uVar7);
  }
  if (pNew->Id != 0) {
    Ivy_FraigSetActivityFactors_rec(p,pNew,iVar3,uVar7);
  }
LAB_007e2146:
  uVar7 = clock_gettime(3,&local_40);
  uVar4 = (ulong)uVar7;
  if ((int)uVar7 < 0) {
    lVar6 = -1;
  }
  else {
    uVar4 = local_40.tv_sec * 1000000;
    lVar6 = local_40.tv_nsec / 1000 + uVar4;
  }
  p->timeTrav = p->timeTrav + lVar6 + lVar5;
  return (int)uVar4;
}

Assistant:

int Ivy_FraigSetActivityFactors( Ivy_FraigMan_t * p, Ivy_Obj_t * pOld, Ivy_Obj_t * pNew )
{
    int LevelMin, LevelMax;
    abctime clk;
    assert( pOld || pNew );
clk = Abc_Clock(); 
    // reset the active variables
    veci_resize(&p->pSat->act_vars, 0);
    // prepare for traversal
    Ivy_ManIncrementTravId( p->pManFraig );
    // determine the min and max level to visit
    assert( p->pParams->dActConeRatio > 0 && p->pParams->dActConeRatio < 1 );
    LevelMax = IVY_MAX( (pNew ? pNew->Level : 0), (pOld ? pOld->Level : 0) );
    LevelMin = (int)(LevelMax * (1.0 - p->pParams->dActConeRatio));
    // traverse
    if ( pOld && !Ivy_ObjIsConst1(pOld) )
        Ivy_FraigSetActivityFactors_rec( p, pOld, LevelMin, LevelMax );
    if ( pNew && !Ivy_ObjIsConst1(pNew) )
        Ivy_FraigSetActivityFactors_rec( p, pNew, LevelMin, LevelMax );
//Ivy_FraigPrintActivity( p );
p->timeTrav += Abc_Clock() - clk;
    return 1;
}